

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::fail(UtestShell *this,char *text,char *fileName,size_t lineNumber,
                TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  SimpleString *in_RCX;
  SimpleString *in_RDI;
  undefined8 in_R8;
  UtestShell *in_stack_ffffffffffffff28;
  undefined1 *lineNumber_00;
  char *in_stack_ffffffffffffff50;
  UtestShell *in_stack_ffffffffffffff58;
  FailFailure *in_stack_ffffffffffffff60;
  undefined1 local_90 [104];
  undefined8 local_28;
  SimpleString *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  pTVar1 = getTestResult(in_stack_ffffffffffffff28);
  (*pTVar1->_vptr_TestResult[10])();
  lineNumber_00 = &stack0xffffffffffffff60;
  SimpleString::SimpleString(in_RDI,(char *)in_stack_ffffffffffffff28);
  FailFailure::FailFailure
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (size_t)lineNumber_00,local_20);
  (**(code **)(in_RDI->buffer_ + 0x138))(in_RDI,local_90,local_28);
  FailFailure::~FailFailure((FailFailure *)0x121588);
  SimpleString::~SimpleString((SimpleString *)0x121592);
  return;
}

Assistant:

void UtestShell::fail(const char *text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    failWith(FailFailure(this, fileName, lineNumber, text), testTerminator);
}